

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write.cpp
# Opt level: O0

void testWriteBaseHeader(string *tempdir)

{
  int iVar1;
  undefined8 uVar2;
  ostream *poVar3;
  char *pcVar4;
  exr_result_t _test_rv_87;
  exr_result_t _test_rv_86;
  exr_result_t _test_rv_85;
  exr_result_t _test_rv_84;
  exr_result_t _test_rv_83;
  exr_result_t _test_rv_82;
  exr_result_t _test_rv_81;
  exr_result_t _test_rv_80;
  exr_result_t _test_rv_79;
  exr_result_t _test_rv_78;
  exr_tile_round_mode_t rmode;
  exr_tile_level_mode_t lmode;
  uint32_t tysize;
  uint32_t txsize;
  exr_result_t _test_rv_77;
  exr_result_t _test_rv_76;
  exr_result_t _test_rv_75;
  exr_result_t _test_rv_74;
  exr_result_t _test_rv_73;
  exr_result_t _test_rv_72;
  exr_result_t _test_rv_71;
  exr_result_t _test_rv_70;
  exr_result_t _test_rv_69;
  exr_result_t _test_rv_68;
  uint64_t cto;
  exr_result_t _test_rv_67;
  exr_result_t _test_rv_66;
  exr_result_t _test_rv_65;
  exr_result_t _test_rv_64;
  exr_result_t _test_rv_63;
  exr_result_t _test_rv_62;
  exr_attr_v2f_t swc;
  exr_attr_box2i_t dispw;
  exr_attr_box2i_t dataw;
  exr_result_t _test_rv_61;
  exr_result_t _test_rv_60;
  exr_result_t _test_rv_59;
  exr_result_t _test_rv_58;
  exr_result_t _test_rv_57;
  exr_result_t _test_rv_56;
  exr_result_t _test_rv_55;
  exr_result_t _test_rv_54;
  exr_result_t _test_rv_53;
  exr_result_t _test_rv_52;
  exr_result_t _test_rv_51;
  exr_result_t _test_rv_50;
  exr_result_t _test_rv_49;
  exr_result_t _test_rv_48;
  float dlev;
  exr_result_t _test_rv_47;
  exr_result_t _test_rv_46;
  exr_result_t _test_rv_45;
  exr_result_t _test_rv_44;
  exr_result_t _test_rv_43;
  exr_result_t _test_rv_42;
  exr_result_t _test_rv_41;
  exr_result_t _test_rv_40;
  exr_result_t _test_rv_39;
  exr_result_t _test_rv_38;
  exr_result_t _test_rv_37;
  exr_result_t _test_rv_36;
  int zlev;
  exr_result_t _test_rv_35;
  exr_result_t _test_rv_34;
  exr_result_t _test_rv_33;
  exr_result_t _test_rv_32;
  exr_result_t _test_rv_31;
  exr_result_t _test_rv_30;
  exr_result_t _test_rv_29;
  exr_result_t _test_rv_28;
  exr_result_t _test_rv_27;
  exr_result_t _test_rv_26;
  exr_result_t _test_rv_25;
  exr_result_t _test_rv_24;
  exr_result_t _test_rv_23;
  exr_result_t _test_rv_22;
  exr_result_t _test_rv_21;
  exr_result_t _test_rv_20;
  exr_result_t _test_rv_19;
  exr_result_t _test_rv_18;
  exr_result_t _test_rv_17;
  exr_result_t _test_rv_16;
  exr_result_t _test_rv_15;
  exr_result_t _test_rv_14;
  exr_result_t _test_rv_13;
  exr_storage_t storage;
  exr_result_t _test_rv_12;
  exr_result_t _test_rv_11;
  exr_result_t _test_rv_10;
  exr_result_t _test_rv_9;
  exr_result_t _test_rv_8;
  char *partname;
  exr_result_t _test_rv_7;
  exr_chunk_info_t cinfo;
  exr_result_t _test_rv_6;
  exr_result_t _test_rv_5;
  exr_result_t _test_rv_4;
  exr_result_t _test_rv_3;
  exr_result_t _test_rv_2;
  exr_result_t _test_rv_1;
  exr_result_t _test_rv;
  exr_context_initializer_t cinit;
  uint32_t verflags;
  int partidx;
  string outfn;
  exr_context_t outf;
  undefined4 in_stack_ffffffffffffe638;
  undefined4 uVar5;
  undefined4 in_stack_ffffffffffffe63c;
  uint in_stack_ffffffffffffe644;
  char *in_stack_ffffffffffffe648;
  char *in_stack_ffffffffffffe650;
  char *in_stack_ffffffffffffe660;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe668;
  undefined1 local_2a8 [4];
  undefined1 local_2a4 [4];
  int local_2a0;
  int local_29c;
  int local_298;
  int local_294;
  int local_290;
  int local_28c;
  int local_288;
  int local_284;
  undefined4 local_280;
  undefined4 uStack_27c;
  undefined4 uStack_278;
  undefined4 uStack_274;
  int local_270;
  int local_26c;
  int local_268;
  int local_264;
  long local_260;
  int local_258;
  int local_254;
  int local_250;
  int local_24c;
  int local_248;
  int local_244;
  undefined8 local_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  int local_20c;
  int local_208;
  int local_204;
  int local_200;
  int local_1fc;
  int local_1f8;
  int local_1f4;
  int local_1f0;
  int local_1ec;
  int local_1e8;
  int local_1e4;
  int local_1e0;
  int local_1dc;
  int local_1d8;
  float local_1d4;
  int local_1d0;
  int local_1cc;
  int local_1c8;
  int local_1c4;
  int local_1c0;
  int local_1bc;
  int local_1b8;
  int local_1b4;
  int local_1b0;
  int local_1ac;
  int local_1a8;
  int local_1a4;
  int local_1a0;
  int local_19c;
  int local_198;
  int local_194;
  int local_190;
  int local_18c;
  int local_188;
  int local_184;
  int local_180;
  int local_17c;
  int local_178;
  int local_174;
  int local_170;
  int local_16c;
  int local_168;
  int local_164;
  int local_160;
  int local_15c;
  int local_158;
  int local_154;
  int local_150;
  int local_14c;
  int local_148;
  int local_144;
  int local_140;
  int local_13c;
  int local_138;
  int local_134;
  int local_130;
  int local_12c;
  char *local_128;
  int local_11c;
  undefined1 local_118 [68];
  int local_d4;
  int local_d0;
  int local_cc;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_ac;
  undefined8 local_a8;
  code *pcStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  int local_38;
  int local_34;
  string local_30 [32];
  undefined8 local_10 [2];
  
  std::operator+(in_stack_ffffffffffffe668,in_stack_ffffffffffffe660);
  local_58 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_48 = 0;
  local_a8 = 0x68;
  uStack_50 = 0xbf800000fffffffe;
  pcStack_a0 = err_cb;
  uVar2 = std::__cxx11::string::c_str();
  local_ac = exr_start_write(local_10,uVar2,0,&local_a8);
  if (local_ac != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_ac);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_ac);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,in_stack_ffffffffffffe638));
  }
  local_c0 = exr_get_count(local_10[0],&local_34);
  if (local_c0 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_c0);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_c0);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,in_stack_ffffffffffffe638));
  }
  if (local_34 != 0) {
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,in_stack_ffffffffffffe638));
  }
  local_c4 = exr_get_count(0,&local_34);
  if (local_c4 != 2) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_c4);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_c4);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,2);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(2);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,in_stack_ffffffffffffe638));
  }
  local_c8 = exr_get_count(local_10[0],0);
  if (local_c8 != 3) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_c8);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_c8);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(3);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,in_stack_ffffffffffffe638));
  }
  local_cc = exr_add_part(0,"beauty",1,&local_34);
  if (local_cc != 2) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_cc);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_cc);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,2);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(2);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,in_stack_ffffffffffffe638));
  }
  local_d0 = exr_add_part(local_10[0],"beauty",1,&local_34);
  if (local_d0 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_d0);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_d0);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,in_stack_ffffffffffffe638));
  }
  if (local_34 != 0) {
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,in_stack_ffffffffffffe638));
  }
  local_d4 = exr_get_count(local_10[0],&local_34);
  if (local_d4 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_d4);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_d4);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,in_stack_ffffffffffffe638));
  }
  if (local_34 != 1) {
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,in_stack_ffffffffffffe638));
  }
  local_34 = 0;
  local_11c = exr_read_scanline_chunk_info(local_10[0],0,0x2a,local_118);
  if (local_11c != 7) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_11c);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_11c);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,7);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(7);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,in_stack_ffffffffffffe638));
  }
  local_12c = exr_get_name(0,local_34,&local_128);
  if (local_12c != 2) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_12c);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_12c);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,2);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(2);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,in_stack_ffffffffffffe638));
  }
  local_130 = exr_get_name(local_10[0],local_34 + -1,&local_128);
  if (local_130 != 4) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_130);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_130);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,4);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(4);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,in_stack_ffffffffffffe638));
  }
  local_134 = exr_get_name(local_10[0],local_34 + 1,&local_128);
  if (local_134 != 4) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_134);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_134);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,4);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(4);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,in_stack_ffffffffffffe638));
  }
  local_138 = exr_get_name(local_10[0],local_34,0);
  if (local_138 != 3) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_138);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_138);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(3);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,in_stack_ffffffffffffe638));
  }
  local_13c = exr_get_name(local_10[0],local_34,&local_128);
  if (local_13c != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_13c);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_13c);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,in_stack_ffffffffffffe638));
  }
  iVar1 = strcmp(local_128,"beauty");
  if (iVar1 != 0) {
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,in_stack_ffffffffffffe638));
  }
  local_144 = exr_get_storage(0,local_34,&local_140);
  if (local_144 != 2) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_144);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_144);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,2);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(2);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,in_stack_ffffffffffffe638));
  }
  local_148 = exr_get_storage(local_10[0],local_34 + -1,&local_140);
  if (local_148 != 4) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_148);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_148);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,4);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(4);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,in_stack_ffffffffffffe638));
  }
  local_14c = exr_get_storage(local_10[0],local_34 + 1,&local_140);
  if (local_14c != 4) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_14c);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_14c);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,4);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(4);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,in_stack_ffffffffffffe638));
  }
  local_150 = exr_get_storage(local_10[0],local_34,0);
  if (local_150 != 3) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_150);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_150);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(3);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,in_stack_ffffffffffffe638));
  }
  local_154 = exr_get_storage(local_10[0],local_34,&local_140);
  if (local_154 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_154);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_154);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,in_stack_ffffffffffffe638));
  }
  if (local_140 != 1) {
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,in_stack_ffffffffffffe638));
  }
  local_158 = exr_set_longname_support(0);
  if (local_158 != 2) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_158);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_158);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,2);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(2);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,in_stack_ffffffffffffe638));
  }
  local_15c = exr_set_longname_support(local_10[0],1);
  if (local_15c != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_15c);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_15c);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,in_stack_ffffffffffffe638));
  }
  local_160 = exr_attr_set_int(local_10[0],local_34,"shortname",0x2a);
  if (local_160 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_160);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_160);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,in_stack_ffffffffffffe638));
  }
  local_164 = exr_set_longname_support(local_10[0],0);
  if (local_164 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_164);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_164);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,in_stack_ffffffffffffe638));
  }
  local_168 = exr_set_longname_support(local_10[0],1);
  if (local_168 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_168);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_168);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,in_stack_ffffffffffffe638));
  }
  uVar5 = 1;
  local_16c = exr_add_channel(local_10[0],local_34,"reallongreallongreallonglongchannelname",1,0);
  if (local_16c != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_16c);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_16c);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,uVar5));
  }
  local_170 = exr_set_longname_support(local_10[0],0);
  if (local_170 != 0xc) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_170);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_170);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xc);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(0xc);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,uVar5));
  }
  local_174 = exr_finish(local_10);
  if (local_174 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_174);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_174);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,uVar5));
  }
  pcVar4 = (char *)std::__cxx11::string::c_str();
  remove(pcVar4);
  uVar2 = std::__cxx11::string::c_str();
  local_178 = exr_start_write(local_10,uVar2,0,&local_a8);
  if (local_178 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_178);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_178);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,uVar5));
  }
  local_17c = exr_add_part(local_10[0],"beauty",1,&local_34);
  if (local_17c != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_17c);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_17c);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,uVar5));
  }
  local_180 = exr_attr_set_int(local_10[0],local_34,"areallongreallongreallonglongname",0x2a);
  if (local_180 != 0xc) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_180);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_180);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xc);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(0xc);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,uVar5));
  }
  local_184 = exr_set_longname_support(local_10[0],1);
  if (local_184 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_184);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_184);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,uVar5));
  }
  local_188 = exr_attr_set_int(local_10[0],local_34,"areallongreallongreallonglongname",0x2a);
  if (local_188 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_188);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_188);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,uVar5));
  }
  local_18c = exr_set_longname_support(local_10[0],0);
  if (local_18c != 0xc) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_18c);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_18c);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xc);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(0xc);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,uVar5));
  }
  local_190 = exr_get_zip_compression_level(0,1);
  if (local_190 != 2) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_190);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_190);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,2);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(2);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,uVar5));
  }
  local_194 = exr_get_zip_compression_level(local_10[0],0xffffffff,0);
  if (local_194 != 4) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_194);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_194);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,4);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(4);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,uVar5));
  }
  local_198 = exr_get_zip_compression_level(local_10[0],5,0);
  if (local_198 != 4) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_198);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_198);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,4);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(4);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,uVar5));
  }
  local_19c = exr_get_zip_compression_level(local_10[0],0,0);
  if (local_19c != 3) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_19c);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_19c);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(3);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,uVar5));
  }
  local_1a0 = -2;
  local_1a4 = exr_get_zip_compression_level(local_10[0],0,&local_1a0);
  if (local_1a4 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1a4);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_1a4);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,uVar5));
  }
  if (local_1a0 != -1) {
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,uVar5));
  }
  local_1a8 = exr_set_zip_compression_level(0,0,5);
  if (local_1a8 != 2) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1a8);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_1a8);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,2);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(2);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,uVar5));
  }
  local_1ac = exr_set_zip_compression_level(local_10[0],0xffffffff,5);
  if (local_1ac != 4) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1ac);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_1ac);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,4);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(4);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,uVar5));
  }
  local_1b0 = exr_set_zip_compression_level(local_10[0],5);
  if (local_1b0 != 4) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1b0);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_1b0);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,4);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(4);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,uVar5));
  }
  local_1b4 = exr_set_zip_compression_level(local_10[0],0,0xfffffffe);
  if (local_1b4 != 3) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1b4);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_1b4);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(3);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,uVar5));
  }
  local_1b8 = exr_set_zip_compression_level(local_10[0],0,0x2a);
  if (local_1b8 != 3) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1b8);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_1b8);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(3);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,uVar5));
  }
  local_1bc = exr_set_zip_compression_level(local_10[0],0,4);
  if (local_1bc != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1bc);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_1bc);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,uVar5));
  }
  local_1c0 = exr_get_zip_compression_level(local_10[0],0,&local_1a0);
  if (local_1c0 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1c0);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_1c0);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,uVar5));
  }
  if (local_1a0 != 4) {
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,uVar5));
  }
  local_1c4 = exr_get_dwa_compression_level(0);
  if (local_1c4 != 2) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1c4);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_1c4);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,2);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(2);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,uVar5));
  }
  local_1c8 = exr_get_dwa_compression_level(local_10[0],0xffffffff,0);
  if (local_1c8 != 4) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1c8);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_1c8);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,4);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(4);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,uVar5));
  }
  local_1cc = exr_get_dwa_compression_level(local_10[0],5,0);
  if (local_1cc != 4) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1cc);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_1cc);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,4);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(4);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,uVar5));
  }
  local_1d0 = exr_get_dwa_compression_level(local_10[0],0,0);
  if (local_1d0 != 3) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1d0);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_1d0);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(3);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,uVar5));
  }
  local_1d4 = -3.0;
  local_1d8 = exr_get_dwa_compression_level(local_10[0],0,&local_1d4);
  if (local_1d8 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1d8);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_1d8);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,uVar5));
  }
  if ((local_1d4 != 45.0) || (NAN(local_1d4))) {
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,uVar5));
  }
  local_1dc = exr_set_dwa_compression_level(0x40a00000,0);
  if (local_1dc != 2) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1dc);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_1dc);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,2);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(2);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,uVar5));
  }
  local_1e0 = exr_set_dwa_compression_level(0x40a00000,local_10[0],0xffffffff);
  if (local_1e0 != 4) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1e0);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_1e0);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,4);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(4);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,uVar5));
  }
  local_1e4 = exr_set_dwa_compression_level(0x40a00000,local_10[0],5);
  if (local_1e4 != 4) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1e4);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_1e4);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,4);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(4);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,uVar5));
  }
  local_1e8 = exr_set_dwa_compression_level(0xc0000000,local_10[0],0);
  if (local_1e8 != 3) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1e8);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_1e8);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(3);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,uVar5));
  }
  local_1ec = exr_set_dwa_compression_level(0x7f800000,local_10[0],0);
  if (local_1ec != 3) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1ec);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_1ec);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(3);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,uVar5));
  }
  local_1f0 = exr_set_dwa_compression_level(0x7fc00000,local_10[0],0);
  if (local_1f0 != 3) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1f0);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_1f0);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(3);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,uVar5));
  }
  local_1f4 = exr_set_dwa_compression_level(0x42280000,local_10[0],0);
  if (local_1f4 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1f4);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_1f4);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,uVar5));
  }
  local_1f8 = exr_get_dwa_compression_level(local_10[0],0,&local_1d4);
  if (local_1f8 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1f8);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_1f8);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,uVar5));
  }
  if ((local_1d4 != 42.0) || (NAN(local_1d4))) {
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,uVar5));
  }
  local_1fc = exr_set_dwa_compression_level(0x43d20000,local_10[0],0);
  if (local_1fc != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1fc);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_1fc);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,uVar5));
  }
  local_200 = exr_get_dwa_compression_level(local_10[0],0,&local_1d4);
  if (local_200 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_200);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_200);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,uVar5));
  }
  if ((local_1d4 != 420.0) || (NAN(local_1d4))) {
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,uVar5));
  }
  local_204 = exr_finish(local_10);
  if (local_204 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_204);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_204);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,uVar5));
  }
  pcVar4 = (char *)std::__cxx11::string::c_str();
  remove(pcVar4);
  uVar2 = std::__cxx11::string::c_str();
  local_208 = exr_start_write(local_10,uVar2,0,&local_a8);
  if (local_208 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_208);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_208);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,uVar5));
  }
  local_20c = exr_add_part(local_10[0],"beauty",0,&local_34);
  if (local_20c != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_20c);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_20c);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,uVar5));
  }
  local_228 = 0xfffffffdfffffffe;
  uStack_220 = 0x20300000202;
  local_238 = 0;
  uStack_230 = 0x20000000200;
  local_240 = 0x3f0000003f000000;
  uVar5 = 2;
  local_244 = exr_initialize_required_attr
                        (0x3f800000,local_10[0],local_34,&local_228,&local_238,&local_240,0);
  if (local_244 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_244);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_244);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,uVar5));
  }
  uVar5 = 1;
  local_248 = exr_add_channel(local_10[0],local_34,"R",1,0);
  if (local_248 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_248);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_248);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,uVar5));
  }
  uVar5 = 1;
  local_24c = exr_add_channel(local_10[0],local_34,"G",1,0);
  if (local_24c != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_24c);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_24c);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,uVar5));
  }
  uVar5 = 1;
  local_250 = exr_add_channel(local_10[0],local_34,"B",1,0);
  if (local_250 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_250);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_250);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,uVar5));
  }
  local_254 = exr_write_header(local_10[0]);
  if (local_254 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_254);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_254);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,uVar5));
  }
  local_258 = exr_get_file_version_and_flags(local_10[0],&local_38);
  if (local_258 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_258);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_258);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,uVar5));
  }
  if (local_38 != 2) {
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,uVar5));
  }
  local_264 = exr_get_chunk_table_offset(local_10[0],0,&local_260);
  if (local_264 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_264);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_264);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,uVar5));
  }
  if (local_260 != 0x16c) {
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,uVar5));
  }
  local_268 = exr_finish(local_10);
  if (local_268 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_268);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_268);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,uVar5));
  }
  pcVar4 = (char *)std::__cxx11::string::c_str();
  remove(pcVar4);
  uVar2 = std::__cxx11::string::c_str();
  local_26c = exr_start_write(local_10,uVar2,0,&local_a8);
  if (local_26c != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_26c);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_26c);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,uVar5));
  }
  local_270 = exr_add_part(local_10[0],"beauty",1,&local_34);
  if (local_270 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_270);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_270);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,uVar5));
  }
  local_280 = 0;
  uStack_27c = 0;
  uStack_278 = 0x200;
  uStack_274 = 0x200;
  local_228 = 0;
  uStack_220 = 0x20000000200;
  uVar5 = 2;
  local_284 = exr_initialize_required_attr
                        (0x3f800000,local_10[0],local_34,&local_228,&local_238,&local_240,0);
  if (local_284 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_284);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_284);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,uVar5));
  }
  uVar5 = 1;
  local_288 = exr_add_channel(local_10[0],local_34,"R",1,0);
  if (local_288 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_288);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_288);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,uVar5));
  }
  uVar5 = 1;
  local_28c = exr_add_channel(local_10[0],local_34,"G",1,0);
  if (local_28c != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_28c);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_28c);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,uVar5));
  }
  uVar5 = 1;
  local_290 = exr_add_channel(local_10[0],local_34,"B",1,0);
  if (local_290 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_290);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_290);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,uVar5));
  }
  local_294 = exr_write_header(local_10[0]);
  if (local_294 != 0xd) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_294);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_294);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xd);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(0xd);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,uVar5));
  }
  local_298 = exr_set_tile_descriptor(local_10[0],local_34,0x20,0x20,0);
  if (local_298 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_298);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_298);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,uVar5));
  }
  iVar1 = exr_get_tile_descriptor(0,local_34,&local_29c,&local_2a0,local_2a4,local_2a8);
  if (iVar1 != 2) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(iVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,2);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(2);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,uVar5));
  }
  iVar1 = exr_get_tile_descriptor(local_10[0],0xffffffff,&local_29c,&local_2a0,local_2a4,local_2a8);
  if (iVar1 != 4) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(iVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,4);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(4);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,uVar5));
  }
  iVar1 = exr_get_tile_descriptor
                    (local_10[0],local_34 + 10,&local_29c,&local_2a0,local_2a4,local_2a8);
  if (iVar1 != 4) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(iVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,4);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(4);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,uVar5));
  }
  iVar1 = exr_get_tile_descriptor(local_10[0],local_34,&local_29c,&local_2a0,local_2a4,local_2a8);
  if (iVar1 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(iVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,uVar5));
  }
  if (local_29c != 0x20 || local_2a0 != 0x20) {
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,uVar5));
  }
  iVar1 = exr_write_header(local_10[0]);
  if (iVar1 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(iVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,uVar5));
  }
  iVar1 = exr_get_file_version_and_flags(local_10[0],&local_38);
  if (iVar1 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(iVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,uVar5));
  }
  if (local_38 != 0x202) {
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,uVar5));
  }
  iVar1 = exr_finish(local_10);
  if (iVar1 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(iVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,uVar5));
  }
  pcVar4 = (char *)std::__cxx11::string::c_str();
  remove(pcVar4);
  uVar2 = std::__cxx11::string::c_str();
  iVar1 = exr_start_write(local_10,uVar2,0,&local_a8);
  if (iVar1 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(iVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,uVar5));
  }
  iVar1 = exr_write_header(local_10[0]);
  if (iVar1 != 6) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(iVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,6);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(6);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,uVar5));
  }
  iVar1 = exr_finish(local_10);
  if (iVar1 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(iVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(pcVar4,(char *)poVar3,in_stack_ffffffffffffe644,
                   (char *)CONCAT44(in_stack_ffffffffffffe63c,uVar5));
  }
  pcVar4 = (char *)std::__cxx11::string::c_str();
  remove(pcVar4);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void
testWriteBaseHeader (const std::string& tempdir)
{
    exr_context_t outf;
    std::string   outfn = tempdir + "testattr.exr";
    int           partidx;
    uint32_t      verflags;

    exr_context_initializer_t cinit = EXR_DEFAULT_CONTEXT_INITIALIZER;
    cinit.error_handler_fn          = &err_cb;

    EXRCORE_TEST_RVAL (exr_start_write (
        &outf, outfn.c_str (), EXR_WRITE_FILE_DIRECTLY, &cinit));

    EXRCORE_TEST_RVAL (exr_get_count (outf, &partidx));
    EXRCORE_TEST (partidx == 0);
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG, exr_get_count (NULL, &partidx));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT, exr_get_count (outf, NULL));

    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG,
        exr_add_part (NULL, "beauty", EXR_STORAGE_TILED, &partidx));
    EXRCORE_TEST_RVAL (
        exr_add_part (outf, "beauty", EXR_STORAGE_TILED, &partidx));
    EXRCORE_TEST (partidx == 0);
    EXRCORE_TEST_RVAL (exr_get_count (outf, &partidx));
    EXRCORE_TEST (partidx == 1);
    partidx = 0;

    exr_chunk_info_t cinfo;
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_NOT_OPEN_READ,
        exr_read_scanline_chunk_info (outf, partidx, 42, &cinfo));

    const char* partname;
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG, exr_get_name (NULL, partidx, &partname));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_ARGUMENT_OUT_OF_RANGE,
        exr_get_name (outf, partidx - 1, &partname));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_ARGUMENT_OUT_OF_RANGE,
        exr_get_name (outf, partidx + 1, &partname));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT, exr_get_name (outf, partidx, NULL));
    EXRCORE_TEST_RVAL (exr_get_name (outf, partidx, &partname));
    EXRCORE_TEST (0 == strcmp (partname, "beauty"));

    exr_storage_t storage;
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG, exr_get_storage (NULL, partidx, &storage));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_ARGUMENT_OUT_OF_RANGE,
        exr_get_storage (outf, partidx - 1, &storage));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_ARGUMENT_OUT_OF_RANGE,
        exr_get_storage (outf, partidx + 1, &storage));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT, exr_get_storage (outf, partidx, NULL));
    EXRCORE_TEST_RVAL (exr_get_storage (outf, partidx, &storage));
    EXRCORE_TEST (storage == EXR_STORAGE_TILED);

    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG, exr_set_longname_support (NULL, 0));
    EXRCORE_TEST_RVAL (exr_set_longname_support (outf, 1));
    EXRCORE_TEST_RVAL (exr_attr_set_int (outf, partidx, "shortname", 42));
    EXRCORE_TEST_RVAL (exr_set_longname_support (outf, 0));
    EXRCORE_TEST_RVAL (exr_set_longname_support (outf, 1));
    EXRCORE_TEST_RVAL (exr_add_channel (
        outf,
        partidx,
        "reallongreallongreallonglongchannelname",
        EXR_PIXEL_HALF,
        EXR_PERCEPTUALLY_LOGARITHMIC,
        1,
        1));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_NAME_TOO_LONG, exr_set_longname_support (outf, 0));
    EXRCORE_TEST_RVAL (exr_finish (&outf));
    remove (outfn.c_str ());

    EXRCORE_TEST_RVAL (exr_start_write (
        &outf, outfn.c_str (), EXR_WRITE_FILE_DIRECTLY, &cinit));
    EXRCORE_TEST_RVAL (
        exr_add_part (outf, "beauty", EXR_STORAGE_TILED, &partidx));

    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_NAME_TOO_LONG,
        exr_attr_set_int (
            outf, partidx, "areallongreallongreallonglongname", 42));

    EXRCORE_TEST_RVAL (exr_set_longname_support (outf, 1));
    EXRCORE_TEST_RVAL (exr_attr_set_int (
        outf, partidx, "areallongreallongreallonglongname", 42));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_NAME_TOO_LONG, exr_set_longname_support (outf, 0));

    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG,
        exr_get_zip_compression_level (NULL, 1, NULL));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_ARGUMENT_OUT_OF_RANGE,
        exr_get_zip_compression_level (outf, -1, NULL));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_ARGUMENT_OUT_OF_RANGE,
        exr_get_zip_compression_level (outf, 5, NULL));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_get_zip_compression_level (outf, 0, NULL));
    int zlev = -2;
    EXRCORE_TEST_RVAL (exr_get_zip_compression_level (outf, 0, &zlev));
    EXRCORE_TEST (zlev == -1);

    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG,
        exr_set_zip_compression_level (NULL, 0, 5));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_ARGUMENT_OUT_OF_RANGE,
        exr_set_zip_compression_level (outf, -1, 5));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_ARGUMENT_OUT_OF_RANGE,
        exr_set_zip_compression_level (outf, 5, 5));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT, exr_set_zip_compression_level (outf, 0, -2));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT, exr_set_zip_compression_level (outf, 0, 42));
    EXRCORE_TEST_RVAL (exr_set_zip_compression_level (outf, 0, 4));
    EXRCORE_TEST_RVAL (exr_get_zip_compression_level (outf, 0, &zlev));
    EXRCORE_TEST (zlev == 4);

    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG,
        exr_get_dwa_compression_level (NULL, 0, NULL));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_ARGUMENT_OUT_OF_RANGE,
        exr_get_dwa_compression_level (outf, -1, NULL));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_ARGUMENT_OUT_OF_RANGE,
        exr_get_dwa_compression_level (outf, 5, NULL));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_get_dwa_compression_level (outf, 0, NULL));
    float dlev = -3.f;
    EXRCORE_TEST_RVAL (exr_get_dwa_compression_level (outf, 0, &dlev));
    EXRCORE_TEST (dlev == 45.f);

    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG,
        exr_set_dwa_compression_level (NULL, 0, 5));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_ARGUMENT_OUT_OF_RANGE,
        exr_set_dwa_compression_level (outf, -1, 5));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_ARGUMENT_OUT_OF_RANGE,
        exr_set_dwa_compression_level (outf, 5, 5));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_set_dwa_compression_level (outf, 0, -2.f));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_set_dwa_compression_level (outf, 0, INFINITY));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_set_dwa_compression_level (outf, 0, NAN));
    EXRCORE_TEST_RVAL (exr_set_dwa_compression_level (outf, 0, 42.f));
    EXRCORE_TEST_RVAL (exr_get_dwa_compression_level (outf, 0, &dlev));
    EXRCORE_TEST (dlev == 42.f);
    EXRCORE_TEST_RVAL (exr_set_dwa_compression_level (outf, 0, 420.f));
    EXRCORE_TEST_RVAL (exr_get_dwa_compression_level (outf, 0, &dlev));
    EXRCORE_TEST (dlev == 420.f);

    EXRCORE_TEST_RVAL (exr_finish (&outf));
    remove (outfn.c_str ());

    EXRCORE_TEST_RVAL (exr_start_write (
        &outf, outfn.c_str (), EXR_WRITE_FILE_DIRECTLY, &cinit));
    EXRCORE_TEST_RVAL (
        exr_add_part (outf, "beauty", EXR_STORAGE_SCANLINE, &partidx));
    exr_attr_box2i_t dataw = {{-2, -3}, {514, 515}};
    exr_attr_box2i_t dispw = {{0, 0}, {512, 512}};
    exr_attr_v2f_t   swc   = {0.5f, 0.5f};
    EXRCORE_TEST_RVAL (exr_initialize_required_attr (
        outf,
        partidx,
        &dataw,
        &dispw,
        1.f,
        &swc,
        1.f,
        EXR_LINEORDER_INCREASING_Y,
        EXR_COMPRESSION_ZIPS));
    EXRCORE_TEST_RVAL (exr_add_channel (
        outf,
        partidx,
        "R",
        EXR_PIXEL_HALF,
        EXR_PERCEPTUALLY_LOGARITHMIC,
        1,
        1));
    EXRCORE_TEST_RVAL (exr_add_channel (
        outf,
        partidx,
        "G",
        EXR_PIXEL_HALF,
        EXR_PERCEPTUALLY_LOGARITHMIC,
        1,
        1));
    EXRCORE_TEST_RVAL (exr_add_channel (
        outf,
        partidx,
        "B",
        EXR_PIXEL_HALF,
        EXR_PERCEPTUALLY_LOGARITHMIC,
        1,
        1));

    EXRCORE_TEST_RVAL (exr_write_header (outf));
    EXRCORE_TEST_RVAL (
        exr_get_file_version_and_flags (outf, &verflags));
    EXRCORE_TEST (verflags == 2);

    uint64_t cto;
    EXRCORE_TEST_RVAL (
        exr_get_chunk_table_offset (outf, 0, &cto));
    EXRCORE_TEST (cto == 364);

    EXRCORE_TEST_RVAL (exr_finish (&outf));
    remove (outfn.c_str ());

    ////

    EXRCORE_TEST_RVAL (exr_start_write (
        &outf, outfn.c_str (), EXR_WRITE_FILE_DIRECTLY, &cinit));
    EXRCORE_TEST_RVAL (
        exr_add_part (outf, "beauty", EXR_STORAGE_TILED, &partidx));
    dataw = {{0, 0}, {512, 512}};
    EXRCORE_TEST_RVAL (exr_initialize_required_attr (
        outf,
        partidx,
        &dataw,
        &dispw,
        1.f,
        &swc,
        1.f,
        EXR_LINEORDER_INCREASING_Y,
        EXR_COMPRESSION_ZIPS));
    EXRCORE_TEST_RVAL (exr_add_channel (
        outf,
        partidx,
        "R",
        EXR_PIXEL_HALF,
        EXR_PERCEPTUALLY_LOGARITHMIC,
        1,
        1));
    EXRCORE_TEST_RVAL (exr_add_channel (
        outf,
        partidx,
        "G",
        EXR_PIXEL_HALF,
        EXR_PERCEPTUALLY_LOGARITHMIC,
        1,
        1));
    EXRCORE_TEST_RVAL (exr_add_channel (
        outf,
        partidx,
        "B",
        EXR_PIXEL_HALF,
        EXR_PERCEPTUALLY_LOGARITHMIC,
        1,
        1));

    EXRCORE_TEST_RVAL_FAIL (EXR_ERR_MISSING_REQ_ATTR, exr_write_header (outf));
    EXRCORE_TEST_RVAL (exr_set_tile_descriptor (
        outf, partidx, 32, 32, EXR_TILE_ONE_LEVEL, EXR_TILE_ROUND_DOWN));

    uint32_t              txsize, tysize;
    exr_tile_level_mode_t lmode;
    exr_tile_round_mode_t rmode;
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG,
        exr_get_tile_descriptor (
            NULL, partidx, &txsize, &tysize, &lmode, &rmode));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_ARGUMENT_OUT_OF_RANGE,
        exr_get_tile_descriptor (outf, -1, &txsize, &tysize, &lmode, &rmode));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_ARGUMENT_OUT_OF_RANGE,
        exr_get_tile_descriptor (
            outf, partidx + 10, &txsize, &tysize, &lmode, &rmode));
    EXRCORE_TEST_RVAL (exr_get_tile_descriptor (
        outf, partidx, &txsize, &tysize, &lmode, &rmode));
    EXRCORE_TEST (txsize == 32 && tysize == 32);

    EXRCORE_TEST_RVAL (exr_write_header (outf));
    EXRCORE_TEST_RVAL (
        exr_get_file_version_and_flags (outf, &verflags));
    EXRCORE_TEST (verflags == (2 | 0x00000200));

    EXRCORE_TEST_RVAL (exr_finish (&outf));
    remove (outfn.c_str ());

    ////

    EXRCORE_TEST_RVAL (exr_start_write (
        &outf, outfn.c_str (), EXR_WRITE_FILE_DIRECTLY, &cinit));
    EXRCORE_TEST_RVAL_FAIL (EXR_ERR_FILE_BAD_HEADER, exr_write_header (outf));
    EXRCORE_TEST_RVAL (exr_finish (&outf));
    remove (outfn.c_str ());
}